

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O0

void vkt::sr::anon_unknown_0::evalTexture2DProj(ShaderEvalContext *c,TexLookupParams *p)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float *pfVar4;
  Vector<float,_4> local_48;
  Vector<float,_4> local_38;
  undefined8 local_28;
  undefined8 local_20;
  TexLookupParams *local_18;
  TexLookupParams *p_local;
  ShaderEvalContext *c_local;
  
  local_18 = p;
  p_local = (TexLookupParams *)c;
  pfVar4 = tcu::Vector<float,_4>::x(c->in);
  fVar1 = *pfVar4;
  pfVar4 = tcu::Vector<float,_4>::w((Vector<float,_4> *)(p_local + 1));
  fVar2 = *pfVar4;
  pfVar4 = tcu::Vector<float,_4>::y((Vector<float,_4> *)(p_local + 1));
  fVar3 = *pfVar4;
  pfVar4 = tcu::Vector<float,_4>::w((Vector<float,_4> *)(p_local + 1));
  texture2D((anon_unknown_0 *)&local_48,c,fVar1 / fVar2,fVar3 / *pfVar4,local_18->lod);
  tcu::operator*((tcu *)&local_38,&local_48,&local_18->scale);
  tcu::operator+((tcu *)&local_28,&local_38,&local_18->bias);
  *(undefined8 *)p_local[0xc].scale.m_data = local_28;
  *(undefined8 *)(p_local[0xc].scale.m_data + 2) = local_20;
  return;
}

Assistant:

static void		evalTexture2DProj		(ShaderEvalContext& c, const TexLookupParams& p)	{ c.color = texture2D(c, c.in[0].x()/c.in[0].w(), c.in[0].y()/c.in[0].w(), p.lod)*p.scale + p.bias; }